

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TLaplaceExample1::uxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *disp)

{
  Fad<double> *pFVar1;
  _func_int **pp_Var2;
  long lVar3;
  bool bVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  value_type vVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  int64_t iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  TPZVec<Fad<double>_> **ppTVar17;
  EVP_PKEY_CTX *pEVar18;
  TPZVec<Fad<double>_> *pTVar19;
  FadCst<int> FVar20;
  double *pdVar21;
  double *pdVar22;
  uint uVar23;
  int i_1;
  ulong uVar24;
  long lVar25;
  int i;
  ulong uVar26;
  long lVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Fad<double> freq;
  Fad<double> theta;
  Fad<double> t;
  Fad<double> mult;
  Fad<double> Prod;
  Fad<double> temp;
  Fad<double> coefs [8];
  Fad<double> r;
  Fad<double> r2;
  TPZManVector<Fad<double>,_3> xloc;
  undefined1 local_608 [16];
  TPZVec<Fad<double>_> *pTStack_5f8;
  TPZVec<Fad<double>_> *pTStack_5f0;
  undefined1 local_5e8 [12];
  uint uStack_5dc;
  FadCst<int> FStack_5d8;
  TPZVec<Fad<double>_> *pTStack_5d0;
  TPZVec<Fad<double>_> *local_5c8;
  TPZVec<Fad<double>_> *local_5c0;
  undefined1 local_5b8 [12];
  uint uStack_5ac;
  TPZVec<Fad<double>_> *pTStack_5a8;
  TPZVec<Fad<double>_> *pTStack_5a0;
  TPZVec<Fad<double>_> local_590;
  TPZVec<Fad<double>_> *local_570;
  TPZVec<Fad<double>_> local_568;
  TPZVec<Fad<double>_> local_548;
  TPZVec<Fad<double>_> local_528;
  TPZVec<Fad<double>_> local_508;
  double local_4e8;
  undefined1 local_4e0 [24];
  TPZVec<Fad<double>_> *local_4c8;
  FadExpr<FadFuncTanh<Fad<double>_>_> *local_4c0;
  undefined1 local_4b8 [16];
  EVP_PKEY_CTX *pEStack_4a8;
  TPZVec<Fad<double>_> *pTStack_4a0;
  TPZVec<Fad<double>_> *local_498;
  uint local_490;
  EVP_PKEY_CTX *local_488;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_480;
  TPZVec<Fad<double>_> *local_478;
  uint local_470;
  EVP_PKEY_CTX *local_468;
  TPZVec<Fad<double>_> *pTStack_460;
  TPZVec<Fad<double>_> *local_458;
  uint local_450;
  EVP_PKEY_CTX *local_448;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_440;
  TPZVec<Fad<double>_> *local_438;
  uint local_430;
  EVP_PKEY_CTX *local_428;
  TPZVec<Fad<double>_> *pTStack_420;
  TPZVec<Fad<double>_> *local_418;
  uint local_410;
  EVP_PKEY_CTX *local_408;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_400;
  TPZVec<Fad<double>_> *local_3f8;
  uint local_3f0;
  EVP_PKEY_CTX *local_3e8;
  TPZVec<Fad<double>_> *pTStack_3e0;
  TPZVec<Fad<double>_> *local_3d8;
  uint local_3d0;
  EVP_PKEY_CTX *local_3c8;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFStack_3c0;
  TPZVec<Fad<double>_> local_3b0;
  undefined1 local_390 [24];
  uint local_378;
  void *local_370;
  undefined8 local_368;
  undefined1 local_360 [24];
  TPZVec<Fad<double>_> *local_348;
  undefined1 local_340 [24];
  int local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  Fad<double> local_310;
  Fad<double> local_2f0;
  Fad<double> local_2d0;
  Fad<double> local_2b0;
  Fad<double> local_290;
  Fad<double> local_270;
  Fad<double> local_250;
  TPZManVector<Fad<double>,_3> local_230;
  Fad<double> local_1b0;
  Fad<double> local_190;
  Fad<double> local_170;
  Fad<double> local_150;
  Fad<double> local_130;
  Fad<double> local_110;
  Fad<double> local_f0;
  undefined1 local_d0 [24];
  TPZVec<Fad<double>_> *local_b8;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_570 = x;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_230,x);
  if (0 < local_230.super_TPZVec<Fad<double>_>.fNElements) {
    pdVar21 = (this->fCenter).super_TPZVec<double>.fStore;
    lVar25 = 0;
    pTVar19 = (TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore;
    do {
      pTVar19->_vptr_TPZVec = (_func_int **)((double)pTVar19->_vptr_TPZVec - pdVar21[lVar25]);
      lVar25 = lVar25 + 1;
      pTVar19 = pTVar19 + 1;
    } while (local_230.super_TPZVec<Fad<double>_>.fNElements != lVar25);
  }
  local_340._16_8_ = 0.0;
  local_328 = 0;
  local_320 = 0;
  uStack_318 = 0;
  if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
    lVar27 = 0;
    lVar25 = 0;
    do {
      local_4b8._0_8_ = (long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar27;
      local_4b8._8_8_ = local_4b8._0_8_;
      Fad<double>::operator+=
                ((Fad<double> *)(local_340 + 0x10),
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_4b8);
      lVar25 = lVar25 + 1;
      lVar27 = lVar27 + 0x20;
    } while (lVar25 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
  }
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt
            ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)(local_340 + 0x10));
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,(FadFuncSqrt<Fad<double>_> *)local_5e8
            );
  Fad<double>::~Fad((Fad<double> *)local_5e8);
  dVar31 = 0.0;
  if ((double)local_4b8._8_8_ < 0.0) {
    local_390._16_8_ = sqrt((double)local_4b8._8_8_);
  }
  else {
    local_390._16_8_ = SQRT((double)local_4b8._8_8_);
  }
  local_378 = 0;
  local_370 = (void *)0x0;
  if ((long)(int)(uint)pEStack_4a8 < 1) {
    local_368 = 0;
  }
  else {
    local_378 = (uint)pEStack_4a8;
    uVar26 = (long)(int)(uint)pEStack_4a8 * 8;
    local_370 = operator_new__(uVar26);
    local_368 = 0;
    uVar24 = 0;
    do {
      ppTVar17 = (TPZVec<Fad<double>_> **)((long)pTStack_4a0 + uVar24);
      if ((uint)pEStack_4a8 == 0) {
        ppTVar17 = &local_498;
      }
      if ((double)local_4b8._8_8_ < 0.0) {
        local_5c0 = *ppTVar17;
        dVar30 = sqrt((double)local_4b8._8_8_);
        pTVar19 = local_5c0;
      }
      else {
        dVar30 = SQRT((double)local_4b8._8_8_);
        pTVar19 = *ppTVar17;
      }
      dVar31 = 0.0;
      *(double *)((long)local_370 + uVar24) = (double)pTVar19 / (dVar30 + dVar30);
      uVar24 = uVar24 + 8;
    } while (uVar26 != uVar24);
  }
  Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
  local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
  local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
  pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
  pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
  local_5e8._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore;
  unique0x10006d4c = (TPZVec<Fad<double>_> *)local_4b8;
  Fad<double>::operator=
            (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_5e8);
  Fad<double>::~Fad((Fad<double> *)local_4b8);
  pdVar21 = *(double **)&local_570->fStore;
  local_250.val_ = *pdVar21;
  uVar28 = SUB84(local_250.val_,0);
  uVar29 = (undefined4)((ulong)local_250.val_ >> 0x20);
  uVar13 = *(uint *)(pdVar21 + 1);
  local_250.dx_.ptr_to_data = (double *)0x0;
  pdVar22 = pdVar21;
  local_250.dx_.num_elts = uVar13;
  if ((long)(int)uVar13 != 0) {
    uVar24 = 0xffffffffffffffff;
    if (-1 < (int)uVar13) {
      uVar24 = (long)(int)uVar13 * 8;
    }
    local_250.dx_.ptr_to_data = (double *)operator_new__(uVar24);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_250.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar21[2],
               (EVP_PKEY_CTX *)(ulong)uVar13);
    uVar28 = SUB84(local_250.val_,0);
    uVar29 = (undefined4)((ulong)local_250.val_ >> 0x20);
    pdVar22 = *(double **)&local_570->fStore;
  }
  local_5c0 = (TPZVec<Fad<double>_> *)CONCAT44(uVar29,uVar28);
  local_250.defaultVal = pdVar21[3];
  local_b0.val_ = pdVar22[4];
  uVar28 = SUB84(local_b0.val_,0);
  uVar29 = (undefined4)((ulong)local_b0.val_ >> 0x20);
  uVar13 = *(uint *)(pdVar22 + 5);
  local_b0.dx_.ptr_to_data = (double *)0x0;
  local_b0.dx_.num_elts = uVar13;
  if ((long)(int)uVar13 != 0) {
    uVar24 = 0xffffffffffffffff;
    if (-1 < (int)uVar13) {
      uVar24 = (long)(int)uVar13 * 8;
    }
    local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar24);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar22[6],
               (EVP_PKEY_CTX *)(ulong)uVar13);
    uVar28 = SUB84(local_b0.val_,0);
    uVar29 = (undefined4)((ulong)local_b0.val_ >> 0x20);
  }
  local_4e8 = (double)CONCAT44(uVar29,uVar28);
  local_b0.defaultVal = pdVar22[7];
  Fad<double>::~Fad(&local_b0);
  Fad<double>::~Fad(&local_250);
  pFVar1 = local_230.super_TPZVec<Fad<double>_>.fStore;
  uVar28 = local_4b8._12_4_;
  uVar13 = uStack_5ac;
  uVar15 = local_590.fStore._4_4_;
  switch(this->fExact) {
  case EConst:
    disp->fStore->val_ = gC + disp->fStore->val_;
    break;
  case EX:
    pFVar1 = disp->fStore;
    uVar13 = ((local_230.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
    uVar24 = (ulong)uVar13;
    if (uVar24 != 0) {
      uVar15 = (pFVar1->dx_).num_elts;
      pdVar21 = *(double **)((long)local_230.super_TPZVec<Fad<double>_>.fStore + 0x10);
      if ((ulong)uVar15 == 0) {
        (pFVar1->dx_).num_elts = uVar13;
        uVar26 = 0xffffffffffffffff;
        if (-1 < (int)uVar13) {
          uVar26 = uVar24 * 8;
        }
        pdVar22 = (double *)operator_new__(uVar26);
        (pFVar1->dx_).ptr_to_data = pdVar22;
        if (0 < (int)uVar13) {
          uVar26 = 0;
          do {
            pdVar22[uVar26] = pdVar21[uVar26];
            uVar26 = uVar26 + 1;
          } while (uVar24 != uVar26);
        }
      }
      else if (0 < (int)uVar15) {
        pdVar22 = (pFVar1->dx_).ptr_to_data;
        uVar24 = 0;
        do {
          pdVar22[uVar24] = pdVar21[uVar24] + pdVar22[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar15 != uVar24);
      }
    }
    pFVar1->val_ = (double)(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + pFVar1->val_;
    break;
  case ESinSin:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar25 = 0;
      lVar27 = 0;
      do {
        local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
        pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        FStack_5d8 = (FadCst<int>)
                     ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar25);
        unique0x10006d9c = (TPZVec<Fad<double>_> *)local_4b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_4b8);
        lVar27 = lVar27 + 1;
        lVar25 = lVar25 + 0x20;
      } while (lVar27 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case ECosCos:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar27 = 0;
      lVar25 = 0;
      do {
        local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
        pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar27);
        FStack_5d8.constant_ = 2;
        FStack_5d8.defaultVal = 0;
        unique0x10006d94 = (TPZVec<Fad<double>_> *)local_5b8;
        local_5b8._0_8_ = (TPZVec<Fad<double>_> *)local_4b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>_>_>
                    *)local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_4b8);
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x20;
      } while (lVar25 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case EArcTan:
    local_4b8._0_8_ = (Fad<double> *)0x3fe0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5b8._0_8_ = ((double)local_390._16_8_ + -0.5) * 100.0;
    lVar25 = (long)(int)local_378;
    stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)((ulong)uStack_5ac << 0x20);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    if (0 < lVar25) {
      stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)CONCAT44(uVar13,local_378);
      pTStack_5a8 = (TPZVec<Fad<double>_> *)operator_new__(lVar25 * 8);
      lVar27 = 0;
      do {
        (&pTStack_5a8->_vptr_TPZVec)[lVar27] =
             (_func_int **)(*(double *)((long)local_370 + lVar27 * 8) * 100.0);
        lVar27 = lVar27 + 1;
      } while (lVar25 != lVar27);
    }
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    local_4c0 = (FadExpr<FadFuncTanh<Fad<double>_>_> *)local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4024000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3fd3333333333333;
    stack0xfffffffffffffa20 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_360._0_8_ = &local_568;
    local_568._vptr_TPZVec = (_func_int **)0x400921fb54442d18;
    local_568.fStore = (Fad<double> *)((ulong)local_568.fStore._4_4_ << 0x20);
    local_568.fNElements = 0;
    local_568.fNAlloc = 0;
    local_3b0.fStore = (Fad<double> *)local_360;
    local_360._8_8_ = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_348 = &local_3b0;
    local_390._8_8_ = local_360 + 0x10;
    local_4e0._0_8_ = local_390;
    local_340._0_8_ = &local_548;
    local_548._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
    local_548.fStore = (Fad<double> *)((ulong)local_548.fStore._4_4_ << 0x20);
    local_548.fNElements = 0;
    local_548.fNAlloc = 0;
    local_d0._16_8_ = &local_508;
    local_508._vptr_TPZVec = (_func_int **)0x3fe0000000000000;
    local_508.fStore = (Fad<double> *)((ulong)local_508.fStore._4_4_ << 0x20);
    local_508.fNElements = 0;
    local_508.fNAlloc = 0;
    local_d0._0_8_ = &local_528;
    local_528._vptr_TPZVec = (_func_int **)0x400921fb54442d18;
    local_528.fStore = (Fad<double> *)((ulong)local_528.fStore._4_4_ << 0x20);
    local_528.fNElements = 0;
    local_528.fNAlloc = 0;
    local_4c8 = (TPZVec<Fad<double>_> *)local_d0;
    local_d0._8_8_ = local_390 + 0x10;
    local_b8 = (TPZVec<Fad<double>_> *)(local_4e0 + 0x10);
    local_340._8_8_ = local_d0 + 0x10;
    local_4e0._8_8_ = local_340;
    local_3b0.fNElements = (int64_t)local_4c0;
    local_390._0_8_ = (TPZVec<Fad<double>_> *)local_4b8;
    local_360._16_8_ = (TPZVec<Fad<double>_> *)local_5e8;
    local_590._vptr_TPZVec =
         (_func_int **)
         FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
         ::val((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                *)local_4e0);
    uVar15 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
             ::size((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                     *)local_4e0);
    uVar13 = local_590.fStore._4_4_;
    local_590.fStore = (Fad<double> *)((ulong)local_590.fStore._4_4_ << 0x20);
    local_590.fNElements = 0;
    if (0 < (int)uVar15) {
      local_590.fStore = (Fad<double> *)CONCAT44(uVar13,uVar15);
      local_590.fNElements = (int64_t)operator_new__((ulong)uVar15 << 3);
    }
    iVar12 = local_590.fNElements;
    local_590.fNAlloc = 0;
    uVar13 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
             ::size((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                     *)local_4e0);
    if (0 < (int)uVar13) {
      uVar24 = 0;
      do {
        pp_Var2 = (_func_int **)
                  FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                  ::dx((FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>
                        *)local_4e0,(int)uVar24);
        ((_func_int ***)iVar12)[uVar24] = pp_Var2;
        uVar24 = uVar24 + 1;
      } while (uVar13 != uVar24);
    }
    Fad<double>::~Fad((Fad<double> *)&local_528);
    Fad<double>::~Fad((Fad<double> *)&local_508);
    Fad<double>::~Fad((Fad<double> *)&local_548);
    Fad<double>::~Fad((Fad<double> *)&local_568);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    FadFuncAtan<Fad<double>_>::FadFuncAtan
              ((FadFuncAtan<Fad<double>_> *)local_5e8,(Fad<double> *)local_5b8);
    FadExpr<FadFuncAtan<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncAtan<Fad<double>_>_> *)local_4b8,
               (FadFuncAtan<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_568.fStore = (Fad<double> *)&local_590;
    local_568._vptr_TPZVec = (_func_int **)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *)
               &local_568);
    pTVar19 = (TPZVec<Fad<double>_> *)(local_4b8 + 8);
    goto LAB_013e830b;
  case EArcTanSingular:
    iVar16 = *(int *)&(this->super_TPZAnalyticSolution).field_0xc;
    if (iVar16 == 1) {
      uVar28 = 0;
      uVar29 = 0x3ff40000;
    }
    else {
      uVar28 = (undefined4)*(undefined8 *)(&DAT_0157ce10 + (ulong)(iVar16 == 3) * 8);
      uVar29 = (undefined4)
               ((ulong)*(undefined8 *)(&DAT_0157ce10 + (ulong)(iVar16 == 3) * 8) >> 0x20);
    }
    local_5c0 = (TPZVec<Fad<double>_> *)CONCAT44(uVar29,uVar28);
    unique0x00005300 = (TPZVec<Fad<double>_> *)(local_340 + 0x10);
    local_568._vptr_TPZVec = (_func_int **)local_5b8;
    local_5b8._0_8_ = (TPZVec<Fad<double>_> *)0x3fe0000000000000;
    stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)((ulong)uStack_5ac << 0x20);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    local_4b8._0_8_ = local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4034000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = &local_568;
    local_590._vptr_TPZVec = (_func_int **)((0.25 - (double)local_340._16_8_) * 20.0);
    lVar25 = (long)local_328;
    local_590.fStore = (Fad<double> *)((ulong)local_590.fStore._4_4_ << 0x20);
    local_590.fNElements = 0;
    local_568.fStore = (Fad<double> *)local_568._vptr_TPZVec;
    if (lVar25 < 1) {
      local_590.fNAlloc = 0;
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
    }
    else {
      local_590.fStore = (Fad<double> *)CONCAT44(uVar15,local_328);
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
      local_590.fNElements = (int64_t)operator_new__(lVar25 * 8);
      local_590.fNAlloc = 0;
      lVar27 = 0;
      do {
        pp_Var2 = (_func_int **)
                  FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                  ::dx((FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                        *)local_4b8,(int)lVar27);
        ((_func_int ***)local_590.fNElements)[lVar27] = pp_Var2;
        lVar27 = lVar27 + 1;
      } while (lVar25 != lVar27);
      iVar16 = *(int *)&(this->super_TPZAnalyticSolution).field_0xc;
    }
    local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
    local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
    local_568.fNElements = 0;
    local_568.fNAlloc = 0;
    if (0 < iVar16) {
      lVar27 = 0;
      lVar25 = 0;
      do {
        local_5e8._0_8_ = *(long *)&local_570->fStore + lVar27;
        local_4b8._8_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
        pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
        unique0x10006d8c = (TPZVec<Fad<double>_> *)local_4b8;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
        Fad<double>::operator*=
                  ((Fad<double> *)&local_568,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)local_5e8);
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x20;
      } while (lVar25 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    FadFuncAtan<Fad<double>_>::FadFuncAtan
              ((FadFuncAtan<Fad<double>_> *)local_5e8,(Fad<double> *)&local_590);
    FadExpr<FadFuncAtan<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncAtan<Fad<double>_>_> *)local_4b8,
               (FadFuncAtan<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    dVar31 = atan((double)local_4b8._8_8_);
    uVar13 = local_548.fStore._4_4_;
    local_548._vptr_TPZVec = (_func_int **)(dVar31 + 1.5707963267948966);
    uVar15 = (uint)pEStack_4a8;
    lVar25 = (long)(int)(uint)pEStack_4a8;
    local_548.fStore = (Fad<double> *)((ulong)local_548.fStore._4_4_ << 0x20);
    local_548.fNElements = 0;
    if (lVar25 < 1) {
      uVar15 = 0;
    }
    else {
      local_548.fStore = (Fad<double> *)CONCAT44(uVar13,(uint)pEStack_4a8);
      local_548.fNElements = (int64_t)operator_new__(lVar25 * 8);
      lVar27 = 0;
      do {
        (&((TPZVec<Fad<double>_> *)local_548.fNElements)->_vptr_TPZVec)[lVar27] =
             (_func_int **)
             ((double)(&pTStack_4a0->_vptr_TPZVec)[lVar27] /
             ((double)local_4b8._8_8_ * (double)local_4b8._8_8_ + 1.0));
        lVar27 = lVar27 + 1;
      } while (lVar25 != lVar27);
    }
    local_548.fNAlloc = 0;
    Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
    pFVar1 = disp->fStore;
    uVar13 = (pFVar1->dx_).num_elts;
    if (uVar15 == uVar13) {
      if (uVar15 != 0) {
        pdVar21 = (pFVar1->dx_).ptr_to_data;
LAB_013e7ff1:
        if (0 < (int)uVar15) {
          uVar24 = 0;
          do {
            pdVar21[uVar24] =
                 (double)((_func_int ***)local_548.fNElements)[uVar24] * (double)local_5c0;
            uVar24 = uVar24 + 1;
          } while (uVar15 != uVar24);
        }
      }
    }
    else if (uVar15 == 0) {
      if (uVar13 != 0) {
        pdVar21 = (pFVar1->dx_).ptr_to_data;
        if (pdVar21 != (double *)0x0) {
          operator_delete__(pdVar21);
        }
        (pFVar1->dx_).num_elts = 0;
        (pFVar1->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar13 != 0) {
        pdVar21 = (pFVar1->dx_).ptr_to_data;
        if (pdVar21 != (double *)0x0) {
          operator_delete__(pdVar21);
        }
        (pFVar1->dx_).ptr_to_data = (double *)0x0;
      }
      (pFVar1->dx_).num_elts = uVar15;
      pdVar21 = (double *)operator_new__((ulong)uVar15 * 8);
      (pFVar1->dx_).ptr_to_data = pdVar21;
      auVar10 = _DAT_014d28c0;
      if ((int)local_548.fStore != 0) goto LAB_013e7ff1;
      lVar25 = (ulong)uVar15 - 1;
      auVar32._8_4_ = (int)lVar25;
      auVar32._0_8_ = lVar25;
      auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
      uVar24 = 0;
      auVar32 = auVar32 ^ _DAT_014d28c0;
      auVar33 = _DAT_014d28b0;
      do {
        auVar34 = auVar33 ^ auVar10;
        if ((bool)(~(auVar34._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar34._0_4_ ||
                    auVar32._4_4_ < auVar34._4_4_) & 1)) {
          pdVar21[uVar24] = (double)local_548.fNAlloc * (double)local_5c0;
        }
        if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
            auVar34._12_4_ <= auVar32._12_4_) {
          pdVar21[uVar24 + 1] = (double)local_548.fNAlloc * (double)local_5c0;
        }
        uVar24 = uVar24 + 2;
        lVar25 = auVar33._8_8_;
        auVar33._0_8_ = auVar33._0_8_ + 2;
        auVar33._8_8_ = lVar25 + 2;
      } while ((uVar15 + 1 & 0xfffffffe) != uVar24);
    }
    pFVar1->val_ = (double)local_5c0 * (double)local_548._vptr_TPZVec;
    Fad<double>::~Fad((Fad<double> *)&local_548);
    pTVar19 = &local_568;
LAB_013e830b:
    Fad<double>::~Fad((Fad<double> *)pTVar19);
    pTVar19 = &local_590;
    goto LAB_013e8318;
  case ESinDist:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar27 = 0;
      lVar25 = 0;
      do {
        local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        stack0xfffffffffffffa20 =
             (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
        FStack_5d8.constant_ = 0;
        FStack_5d8.defaultVal = 0;
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar27);
        pEStack_4a8 = (EVP_PKEY_CTX *)0x3ff199999999999a;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        local_5b8._0_8_ = (TPZVec<Fad<double>_> *)local_5e8;
        local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)local_4b8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x20;
      } while (lVar25 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case E10SinSin:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar27 = 0;
      lVar25 = 0;
      do {
        local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        stack0xfffffffffffffa20 =
             (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
        FStack_5d8.constant_ = 0;
        FStack_5d8.defaultVal = 0;
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar27);
        pEStack_4a8 = (EVP_PKEY_CTX *)0x4024000000000000;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        local_5b8._0_8_ = (TPZVec<Fad<double>_> *)local_5e8;
        local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)local_4b8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x20;
      } while (lVar25 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case E2SinSin:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    disp->fStore->val_ = disp->fStore->val_ + 1.0;
    Fad<double>::~Fad((Fad<double> *)local_4b8);
    if (0 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc) {
      lVar27 = 0;
      lVar25 = 0;
      do {
        local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
        stack0xfffffffffffffa20 =
             (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
        FStack_5d8.constant_ = 0;
        FStack_5d8.defaultVal = 0;
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        register0x00000000 =
             (TPZVec<Fad<double>_> *)
             ((long)&(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar27);
        pEStack_4a8 = (EVP_PKEY_CTX *)0x4000000000000000;
        pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
        local_5b8._0_8_ = (TPZVec<Fad<double>_> *)local_5e8;
        local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5b8;
        Fad<double>::operator*=
                  (disp->fStore,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)local_4b8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x20;
      } while (lVar25 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc);
    }
    break;
  case ESinSinDirNonHom:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_590.fStore = (Fad<double> *)&local_568;
    local_568.fStore = (Fad<double> *)0x4000000000000000;
    local_568.fNElements = 0;
    local_3b0._vptr_TPZVec = (_func_int **)&local_590;
    local_590.fNElements = (int64_t)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x400921fb54442d18;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_548.fStore = (Fad<double> *)&local_508;
    local_508.fStore = (Fad<double> *)0x4000000000000000;
    local_508.fNElements = 0;
    local_548.fNElements = (int64_t)(local_230.super_TPZVec<Fad<double>_>.fStore + 1);
    local_3b0.fStore = (Fad<double> *)&local_548;
    local_528._vptr_TPZVec = (_func_int **)&local_3b0;
    local_4e0._16_8_ = local_5b8;
    local_5b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)((ulong)uStack_5ac << 0x20);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    local_4e0._0_8_ = local_390;
    local_390._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_4e0._8_8_ = local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_4c8 = (TPZVec<Fad<double>_> *)local_4e0;
    local_528.fStore = (Fad<double> *)(local_4e0 + 0x10);
    local_568._vptr_TPZVec = (_func_int **)local_4b8;
    local_508._vptr_TPZVec = (_func_int **)local_5e8;
    local_390._8_8_ = local_548.fNElements;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)&local_528);
    goto LAB_013e821c;
  case ESinMark:
    local_270.val_ =
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec;
    uVar13 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    local_270.dx_.ptr_to_data = (double *)0x0;
    local_270.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_270.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_270.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_270.defaultVal = (double)((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fNAlloc;
    local_110.val_ =
         (double)((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->_vptr_TPZVec
    ;
    uVar13 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->fStore)->
             num_elts;
    local_110.dx_.ptr_to_data = (double *)0x0;
    local_110.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_110.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_110.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)
                 ((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_110.defaultVal =
         (double)((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->fNAlloc;
    atan2(local_110.defaultVal,dVar31);
    Fad<double>::~Fad(&local_110);
    Fad<double>::~Fad(&local_270);
    uVar11 = local_4b8._8_8_;
    local_570 = (TPZVec<Fad<double>_> *)local_4b8._0_8_;
    local_50.val_ = (double)local_4b8._0_8_;
    local_50.dx_.num_elts = local_4b8._8_4_;
    local_50.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_4b8._8_4_ != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)local_4b8._8_4_) {
        uVar24 = (long)(int)local_4b8._8_4_ * 8;
      }
      local_50.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_50.dx_.ptr_to_data,pEStack_4a8,
                 (EVP_PKEY_CTX *)(uVar11 & 0xffffffff));
    }
    local_50.defaultVal = (double)pTStack_4a0;
    Fad<double>::~Fad(&local_50);
    if ((double)local_570 < 0.0) {
      local_4b8._0_8_ = (double)local_4b8._0_8_ + 6.283185307179586;
    }
    if (((local_4e8 <= -1e-15) || ((double)local_5c0 <= 0.0)) || (1e-15 <= local_4e8)) {
      local_568._vptr_TPZVec = (_func_int **)local_5b8;
      local_5b8._0_8_ = (Fad<double> *)0x4000000000000000;
      stack0xfffffffffffffa50 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
      pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
      local_568.fStore = (Fad<double> *)local_608;
      local_608._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x4008000000000000;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      local_590.fStore = (Fad<double> *)&local_568;
      local_590._vptr_TPZVec = (_func_int **)(local_390 + 0x10);
      local_5e8._0_8_ = pow((double)local_390._16_8_,0.6666666666666666);
      pTVar19 = stack0xfffffffffffffa20;
      uVar13 = ((local_568.fStore)->dx_).num_elts;
      if ((int)uVar13 < (int)*(uint *)(local_568._vptr_TPZVec + 1)) {
        uVar13 = *(uint *)(local_568._vptr_TPZVec + 1);
      }
      if ((int)uVar13 < (int)local_378) {
        uVar13 = local_378;
      }
      stack0xfffffffffffffa20 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
      FStack_5d8.constant_ = 0;
      FStack_5d8.defaultVal = 0;
      if ((int)uVar13 < 1) {
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
      }
      else {
        uStack_5dc = SUB84(pTVar19,4);
        stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5dc,uVar13);
        FVar20 = (FadCst<int>)operator_new__((ulong)uVar13 * 8);
        pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
        uVar24 = 0;
        FStack_5d8 = FVar20;
        do {
          vVar8 = FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>::dx
                            ((FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>
                              *)&local_590,(int)uVar24);
          *(value_type *)((long)FVar20 + uVar24 * 8) = vVar8;
          uVar24 = uVar24 + 1;
        } while (uVar13 != uVar24);
      }
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_5b8);
      local_5b8._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
      stack0xfffffffffffffa50 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
      pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
      local_590.fStore = (Fad<double> *)&local_548;
      local_548.fStore = (Fad<double> *)local_4b8;
      local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4008000000000000;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      local_568.fStore = (Fad<double> *)&local_590;
      local_568._vptr_TPZVec = (_func_int **)local_5e8;
      local_590.fNElements = (int64_t)local_608;
      local_548._vptr_TPZVec = (_func_int **)local_5b8;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)&local_568);
      goto LAB_013e821c;
    }
    pFVar1 = disp->fStore;
    pFVar1->val_ = 0.0;
    if ((pFVar1->dx_).num_elts != 0) {
      local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
      Vector<double>::operator=(&pFVar1->dx_,(double *)local_5e8);
    }
    goto LAB_013e823a;
  case ESteklovNonConst:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_498 = (TPZVec<Fad<double>_> *)0x3fdc9f25c5bfedd8;
    local_490 = 0;
    local_488 = (EVP_PKEY_CTX *)0x0;
    pFStack_480 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_478 = (TPZVec<Fad<double>_> *)0x4002aaaaaaaaaaa9;
    local_470 = 0;
    local_468 = (EVP_PKEY_CTX *)0x0;
    pTStack_460 = (TPZVec<Fad<double>_> *)0x0;
    local_458 = (TPZVec<Fad<double>_> *)0xbfe7d9f4cf754632;
    local_450 = 0;
    local_448 = (EVP_PKEY_CTX *)0x0;
    pFStack_440 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_438 = (TPZVec<Fad<double>_> *)0x3fe1c71c71c71c72;
    local_430 = 0;
    local_428 = (EVP_PKEY_CTX *)0x0;
    pTStack_420 = (TPZVec<Fad<double>_> *)0x0;
    local_418 = (TPZVec<Fad<double>_> *)0xbfee363617d8d064;
    local_410 = 0;
    local_408 = (EVP_PKEY_CTX *)0x0;
    pFStack_400 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_3f8 = (TPZVec<Fad<double>_> *)0xbfded097b425ed0e;
    local_3f0 = 0;
    local_3e8 = (EVP_PKEY_CTX *)0x0;
    pTStack_3e0 = (TPZVec<Fad<double>_> *)0x0;
    local_3d8 = (TPZVec<Fad<double>_> *)0xc00336afe00206c6;
    local_3d0 = 0;
    local_3c8 = (EVP_PKEY_CTX *)0x0;
    pFStack_3c0 = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3fe122550cc9a902;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_290.val_ =
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec;
    uVar13 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    local_290.dx_.ptr_to_data = (double *)0x0;
    local_290.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_290.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_290.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_290.defaultVal = (double)((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fNAlloc;
    local_130.val_ =
         (double)((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->_vptr_TPZVec
    ;
    uVar13 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->fStore)->
             num_elts;
    local_130.dx_.ptr_to_data = (double *)0x0;
    local_130.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_130.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_130.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)
                 ((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_130.defaultVal =
         (double)((TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore)->fNAlloc;
    atan2(local_130.defaultVal,dVar31);
    Fad<double>::~Fad(&local_130);
    Fad<double>::~Fad(&local_290);
    pTVar19 = stack0xfffffffffffffa50;
    uVar28 = (undefined4)local_5b8._0_8_;
    uVar29 = SUB84(local_5b8._0_8_,4);
    local_f0.val_ = (double)local_5b8._0_8_;
    local_f0.dx_.num_elts = local_5b8._8_4_;
    local_f0.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_5b8._8_4_ != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)local_5b8._8_4_) {
        uVar24 = (long)(int)local_5b8._8_4_ * 8;
      }
      local_f0.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_f0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTStack_5a8,
                 (EVP_PKEY_CTX *)((ulong)pTVar19 & 0xffffffff));
      uVar28 = SUB84(local_f0.val_,0);
      uVar29 = (undefined4)((ulong)local_f0.val_ >> 0x20);
    }
    local_570 = (TPZVec<Fad<double>_> *)CONCAT44(uVar29,uVar28);
    local_f0.defaultVal = (double)pTStack_5a0;
    Fad<double>::~Fad(&local_f0);
    uVar11 = local_4b8._8_8_;
    if ((double)local_570 < 0.0) {
      local_5b8._0_8_ = (double)local_5b8._0_8_ + 6.283185307179586;
    }
    if ((0.0 <= (double)local_5c0) && (0.0 <= local_4e8)) {
      local_528._vptr_TPZVec = (_func_int **)(local_390 + 0x10);
      local_608._0_8_ = local_4b8._0_8_;
      local_608._8_4_ = local_4b8._8_4_;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_528.fStore = (Fad<double> *)local_5e8;
      if ((long)(int)local_4b8._8_4_ != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_4b8._8_4_) {
          uVar24 = (long)(int)local_4b8._8_4_ * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,pEStack_4a8,(EVP_PKEY_CTX *)(uVar11 & 0xffffffff))
        ;
      }
      uVar13 = local_490;
      local_4e0._16_8_ = local_608;
      pTStack_5f0 = pTStack_4a0;
      local_4c8 = &local_568;
      local_590._vptr_TPZVec = (_func_int **)local_498;
      local_590.fStore = (Fad<double> *)CONCAT44(local_590.fStore._4_4_,local_490);
      local_590.fNElements = 0;
      local_568.fStore = (Fad<double> *)local_5e8;
      local_568.fNElements = (int64_t)local_5b8;
      if ((long)(int)local_490 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_490) {
          uVar24 = (long)(int)local_490 * 8;
        }
        local_590.fNElements = (int64_t)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_590.fNElements,local_488,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      local_4e0._0_8_ = &local_590;
      local_590.fNAlloc = (int64_t)pFStack_480;
      local_4e0._8_8_ = &local_548;
      local_3b0.fStore = (Fad<double> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_508.fStore = (Fad<double> *)&local_3b0;
      local_508._vptr_TPZVec = (_func_int **)&local_528;
      local_548.fStore = (Fad<double> *)local_5e8;
      local_548.fNElements = (int64_t)local_5b8;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    uVar13 = local_470;
    if (((double)local_5c0 <= 0.0) && (0.0 <= local_4e8)) {
      local_528._vptr_TPZVec = (_func_int **)(local_390 + 0x10);
      local_608._0_8_ = local_478;
      local_608._8_4_ = local_470;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_528.fStore = (Fad<double> *)local_5e8;
      if ((long)(int)local_470 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_470) {
          uVar24 = (long)(int)local_470 * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,local_468,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      uVar13 = local_450;
      local_4e0._16_8_ = local_608;
      pTStack_5f0 = pTStack_460;
      local_4c8 = &local_568;
      local_590._vptr_TPZVec = (_func_int **)local_458;
      local_590.fStore = (Fad<double> *)CONCAT44(local_590.fStore._4_4_,local_450);
      local_590.fNElements = 0;
      local_568.fStore = (Fad<double> *)local_5e8;
      local_568.fNElements = (int64_t)local_5b8;
      if ((long)(int)local_450 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_450) {
          uVar24 = (long)(int)local_450 * 8;
        }
        local_590.fNElements = (int64_t)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_590.fNElements,local_448,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      local_4e0._0_8_ = &local_590;
      local_590.fNAlloc = (int64_t)pFStack_440;
      local_4e0._8_8_ = &local_548;
      local_3b0.fStore = (Fad<double> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_508.fStore = (Fad<double> *)&local_3b0;
      local_508._vptr_TPZVec = (_func_int **)&local_528;
      local_548.fStore = (Fad<double> *)local_5e8;
      local_548.fNElements = (int64_t)local_5b8;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    uVar13 = local_430;
    if (((double)local_5c0 < 0.0) && (local_4e8 <= 0.0)) {
      local_528._vptr_TPZVec = (_func_int **)(local_390 + 0x10);
      local_608._0_8_ = local_438;
      local_608._8_4_ = local_430;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_528.fStore = (Fad<double> *)local_5e8;
      if ((long)(int)local_430 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_430) {
          uVar24 = (long)(int)local_430 * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,local_428,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      uVar13 = local_410;
      local_4e0._16_8_ = local_608;
      pTStack_5f0 = pTStack_420;
      local_4c8 = &local_568;
      local_590._vptr_TPZVec = (_func_int **)local_418;
      local_590.fStore = (Fad<double> *)CONCAT44(local_590.fStore._4_4_,local_410);
      local_590.fNElements = 0;
      local_568.fStore = (Fad<double> *)local_5e8;
      local_568.fNElements = (int64_t)local_5b8;
      if ((long)(int)local_410 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_410) {
          uVar24 = (long)(int)local_410 * 8;
        }
        local_590.fNElements = (int64_t)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_590.fNElements,local_408,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      local_4e0._0_8_ = &local_590;
      local_590.fNAlloc = (int64_t)pFStack_400;
      local_4e0._8_8_ = &local_548;
      local_3b0.fStore = (Fad<double> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_508.fStore = (Fad<double> *)&local_3b0;
      local_508._vptr_TPZVec = (_func_int **)&local_528;
      local_548.fStore = (Fad<double> *)local_5e8;
      local_548.fNElements = (int64_t)local_5b8;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    uVar13 = local_3f0;
    if ((0.0 <= (double)local_5c0) && (local_4e8 < 0.0)) {
      local_528._vptr_TPZVec = (_func_int **)(local_390 + 0x10);
      local_608._0_8_ = local_3f8;
      local_608._8_4_ = local_3f0;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_528.fStore = (Fad<double> *)local_5e8;
      if ((long)(int)local_3f0 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_3f0) {
          uVar24 = (long)(int)local_3f0 * 8;
        }
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)pTStack_5f8,local_3e8,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      uVar13 = local_3d0;
      local_4e0._16_8_ = local_608;
      pTStack_5f0 = pTStack_3e0;
      local_4c8 = &local_568;
      local_590._vptr_TPZVec = (_func_int **)local_3d8;
      local_590.fStore = (Fad<double> *)CONCAT44(local_590.fStore._4_4_,local_3d0);
      local_590.fNElements = 0;
      local_568.fStore = (Fad<double> *)local_5e8;
      local_568.fNElements = (int64_t)local_5b8;
      if ((long)(int)local_3d0 != 0) {
        uVar24 = 0xffffffffffffffff;
        if (-1 < (int)local_3d0) {
          uVar24 = (long)(int)local_3d0 * 8;
        }
        local_590.fNElements = (int64_t)operator_new__(uVar24);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_590.fNElements,local_3c8,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      local_4e0._0_8_ = &local_590;
      local_590.fNAlloc = (int64_t)pFStack_3c0;
      local_4e0._8_8_ = &local_548;
      local_3b0.fStore = (Fad<double> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_508.fStore = (Fad<double> *)&local_3b0;
      local_508._vptr_TPZVec = (_func_int **)&local_528;
      local_548.fStore = (Fad<double> *)local_5e8;
      local_548.fNElements = (int64_t)local_5b8;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
    }
    Fad<double>::~Fad((Fad<double> *)local_5b8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    lVar25 = 0xe0;
    do {
      Fad<double>::~Fad((Fad<double> *)(local_4b8 + lVar25));
      lVar25 = lVar25 + -0x20;
    } while (lVar25 != -0x20);
    break;
  case EGalvisNonConst:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x4014000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    if (((double)local_5c0 <= 0.0) && (local_4e8 <= 0.0)) {
      local_508.fStore = (Fad<double> *)&local_590;
      local_590._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore._4_4_ << 0x20);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      local_508._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
      local_568.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_548._vptr_TPZVec = (_func_int **)local_4b8;
      local_548.fStore = (Fad<double> *)0x3ff0000000000000;
      local_548.fNElements = 0;
      pTStack_5f0 = &local_508;
      local_568.fNElements = (int64_t)&local_548;
      local_5b8._0_8_ =
           sin((((double)(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ + 1.0) *
               3.141592653589793) / 3.0);
      pTVar19 = stack0xfffffffffffffa50;
      lVar25 = *(long *)(local_568.fStore)->defaultVal;
      lVar27 = ((long *)(local_568.fStore)->defaultVal)[1];
      uVar13 = *(uint *)(lVar25 + 8);
      uVar15 = *(uint *)(lVar27 + 8);
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      pp_Var2 = *(_func_int ***)local_568.fNElements;
      uVar13 = *(uint *)(pp_Var2 + 1);
      if ((int)uVar15 <= (int)uVar13) {
        uVar15 = uVar13;
      }
      stack0xfffffffffffffa50 =
           (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
      pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar15) {
        uStack_5ac = SUB84(pTVar19,4);
        stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5ac,uVar15);
        pTStack_5a8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar15 << 3);
      }
      pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
      uVar13 = *(uint *)(lVar25 + 8);
      uVar15 = *(uint *)(lVar27 + 8);
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      uVar13 = *(uint *)(pp_Var2 + 1);
      if ((int)uVar15 <= (int)uVar13) {
        uVar15 = uVar13;
      }
      if (0 < (int)uVar15) {
        uVar24 = 0;
        do {
          pp_Var2 = (_func_int **)
                    FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                    ::dx((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                          *)&local_568,(int)uVar24);
          (&pTStack_5a8->_vptr_TPZVec)[uVar24] = pp_Var2;
          uVar24 = uVar24 + 1;
        } while (uVar15 != uVar24);
      }
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      local_4e0._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4e0._8_8_ = &local_568;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_3b0.fStore = (Fad<double> *)local_390;
      local_390._0_8_ = local_5e8;
      local_528._vptr_TPZVec = (_func_int **)&local_3b0;
      local_548._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_548.fStore = (Fad<double> *)((ulong)local_548.fStore & 0xffffffff00000000);
      local_548.fNElements = 0;
      local_548.fNAlloc = 0;
      local_360._16_8_ = local_360;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_348 = (TPZVec<Fad<double>_> *)local_340;
      local_528.fStore = (Fad<double> *)(local_360 + 0x10);
      local_4e0._16_8_ = &local_590;
      local_390._8_8_ = local_4e0._0_8_;
      local_360._0_8_ = local_390._0_8_;
      local_360._8_8_ = &local_548;
      local_340._0_8_ = local_390._0_8_;
      local_340._8_8_ = &local_508;
      local_608._0_8_ =
           FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
           ::val((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                  *)&local_528);
      uVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_528);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar13) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar13;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar13 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_528);
      if (0 < (int)uVar13) {
        uVar24 = 0;
        do {
          pp_Var2 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_528,(int)uVar24);
          (&pTStack_5f8->_vptr_TPZVec)[uVar24] = pp_Var2;
          uVar24 = uVar24 + 1;
        } while (uVar13 != uVar24);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)local_5b8;
      local_590.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_5b8);
    }
    if ((0.0 < (double)local_5c0) && (local_4e8 < 0.0)) {
      local_508._vptr_TPZVec = (_func_int **)&local_528;
      local_528._vptr_TPZVec = (_func_int **)local_4b8;
      local_528.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
      local_508.fStore = (Fad<double> *)&local_590;
      local_590._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      pTStack_5f0 = &local_508;
      local_548.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_3b0.fStore = (Fad<double> *)&local_568;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_548.fNElements = (int64_t)&local_3b0;
      local_3b0._vptr_TPZVec = local_528._vptr_TPZVec;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                ((Fad<double> *)local_5b8,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      local_4e0._0_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_3b0.fStore = (Fad<double> *)local_390;
      local_390._0_8_ = local_5e8;
      local_548._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_548.fStore = (Fad<double> *)((ulong)local_548.fStore & 0xffffffff00000000);
      local_548.fNElements = 0;
      local_548.fNAlloc = 0;
      local_360._16_8_ = local_360;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_348 = (TPZVec<Fad<double>_> *)local_340;
      local_340._8_8_ = &local_508;
      local_528.fStore = (Fad<double> *)(local_360 + 0x10);
      local_528._vptr_TPZVec = (_func_int **)&local_3b0;
      local_4e0._8_8_ = &local_568;
      local_4e0._16_8_ = &local_590;
      local_390._8_8_ = local_4e0._0_8_;
      local_360._0_8_ = local_390._0_8_;
      local_360._8_8_ = &local_548;
      local_340._0_8_ = local_390._0_8_;
      local_608._0_8_ =
           FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
           ::val((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                  *)&local_528);
      uVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_528);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar13) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar13;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar13 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_528);
      if (0 < (int)uVar13) {
        uVar24 = 0;
        do {
          pp_Var2 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_528,(int)uVar24);
          (&pTStack_5f8->_vptr_TPZVec)[uVar24] = pp_Var2;
          uVar24 = uVar24 + 1;
        } while (uVar13 != uVar24);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)local_5b8;
      local_590.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_5b8);
    }
    if (((double)local_5c0 < 0.0) && (0.0 <= local_4e8)) {
      local_508.fStore = (Fad<double> *)&local_590;
      local_590._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      local_508._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
      local_548.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_528.fStore = (Fad<double> *)&local_568;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_548.fNElements = (int64_t)&local_528;
      local_528._vptr_TPZVec = (_func_int **)local_4b8;
      pTStack_5f0 = &local_508;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                ((Fad<double> *)local_5b8,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      local_390._8_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4e0._0_8_ = local_390;
      local_390._0_8_ = local_5e8;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_348 = (TPZVec<Fad<double>_> *)local_360;
      local_3b0.fStore = (Fad<double> *)(local_360 + 0x10);
      local_528._vptr_TPZVec = (_func_int **)&local_3b0;
      local_548._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_548.fStore = (Fad<double> *)((ulong)local_548.fStore & 0xffffffff00000000);
      local_548.fNElements = 0;
      local_548.fNAlloc = 0;
      local_340._0_8_ = local_d0 + 0x10;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_340._8_8_ = local_d0;
      local_528.fStore = (Fad<double> *)local_340;
      local_4e0._8_8_ = &local_568;
      local_4e0._16_8_ = &local_590;
      local_360._0_8_ = local_390._0_8_;
      local_360._8_8_ = local_390._8_8_;
      local_360._16_8_ = local_390._0_8_;
      local_d0._0_8_ = local_390._0_8_;
      local_d0._8_8_ = &local_508;
      local_d0._16_8_ = local_390._0_8_;
      local_b8 = &local_548;
      vVar6 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
              ::val((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                     *)local_528._vptr_TPZVec);
      local_608._0_8_ =
           vVar6 / ((*(double *)**(undefined8 **)&(local_528.fStore)->dx_ +
                    *(double *)(*(undefined8 **)&(local_528.fStore)->dx_)[1]) *
                   (**(double **)(local_528.fStore)->val_ +
                   *(double *)((_func_int **)(local_528.fStore)->val_)[1]));
      uVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_528);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar13) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar13;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar13 << 3);
      }
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar14 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)local_528._vptr_TPZVec);
      uVar13 = *(uint *)(*(_func_int **)(local_528.fStore)->val_ + 8);
      uVar15 = *(uint *)(((_func_int **)(local_528.fStore)->val_)[1] + 8);
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      uVar13 = *(uint *)(**(long **)&(local_528.fStore)->dx_ + 8);
      uVar23 = *(uint *)((*(long **)&(local_528.fStore)->dx_)[1] + 8);
      if ((int)uVar23 < (int)uVar13) {
        uVar23 = uVar13;
      }
      if ((int)uVar23 < (int)uVar15) {
        uVar23 = uVar15;
      }
      if ((int)uVar23 < (int)uVar14) {
        uVar23 = uVar14;
      }
      if (0 < (int)uVar23) {
        uVar24 = 0;
        do {
          pp_Var2 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_528,(int)uVar24);
          (&pTStack_5f8->_vptr_TPZVec)[uVar24] = pp_Var2;
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)local_5b8;
      local_590.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_590);
      Fad<double>::~Fad((Fad<double> *)local_608);
      Fad<double>::~Fad((Fad<double> *)local_5b8);
    }
    if ((0.0 <= (double)local_5c0) && (0.0 <= local_4e8)) {
      local_508._vptr_TPZVec = (_func_int **)&local_528;
      local_528._vptr_TPZVec = (_func_int **)local_4b8;
      local_528.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
      local_508.fStore = (Fad<double> *)&local_590;
      local_590._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      pTStack_5f0 = &local_508;
      local_548.fStore = (Fad<double> *)local_608;
      local_608._8_8_ = (Fad<double> *)0x400921fb54442d18;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      local_3b0.fStore = (Fad<double> *)&local_568;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_548.fNElements = (int64_t)&local_3b0;
      local_3b0._vptr_TPZVec = local_528._vptr_TPZVec;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                ((Fad<double> *)local_5b8,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)0x4010000000000000;
      local_590.fStore = (Fad<double> *)((ulong)local_590.fStore & 0xffffffff00000000);
      local_590.fNElements = 0;
      local_590.fNAlloc = 0;
      local_390._8_8_ = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4e0._0_8_ = local_390;
      local_390._0_8_ = local_5e8;
      local_568._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
      local_568.fNElements = 0;
      local_568.fNAlloc = 0;
      local_4c8 = (TPZVec<Fad<double>_> *)local_4e0;
      local_3b0._vptr_TPZVec = (_func_int **)(local_4e0 + 0x10);
      local_348 = (TPZVec<Fad<double>_> *)local_360;
      local_3b0.fStore = (Fad<double> *)(local_360 + 0x10);
      local_548._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_548.fStore = (Fad<double> *)((ulong)local_548.fStore & 0xffffffff00000000);
      local_548.fNElements = 0;
      local_548.fNAlloc = 0;
      local_340._0_8_ = local_d0 + 0x10;
      local_508._vptr_TPZVec = (_func_int **)0x3ff0000000000000;
      local_508.fStore = (Fad<double> *)((ulong)local_508.fStore & 0xffffffff00000000);
      local_508.fNElements = 0;
      local_508.fNAlloc = 0;
      local_340._8_8_ = local_d0;
      local_d0._8_8_ = &local_508;
      local_528.fStore = (Fad<double> *)local_340;
      local_528._vptr_TPZVec = (_func_int **)&local_3b0;
      local_4e0._8_8_ = &local_568;
      local_4e0._16_8_ = &local_590;
      local_360._0_8_ = local_390._0_8_;
      local_360._8_8_ = local_390._8_8_;
      local_360._16_8_ = local_390._0_8_;
      local_d0._0_8_ = local_390._0_8_;
      local_d0._16_8_ = local_390._0_8_;
      local_b8 = &local_548;
      vVar6 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
              ::val((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                     *)&local_3b0);
      local_608._0_8_ =
           vVar6 / (((double)**(_func_int ***)local_340._8_8_ +
                    (*(Fad<double> **)(local_340._8_8_ + 8))->val_) *
                   ((double)**(_func_int ***)local_340._0_8_ + **(double **)(local_340._0_8_ + 8)));
      uVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)&local_528);
      uVar11 = local_608._8_8_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
      pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
      if (0 < (int)uVar13) {
        local_608._12_4_ = SUB84(uVar11,4);
        local_608._8_4_ = uVar13;
        pTStack_5f8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar13 << 3);
      }
      pTVar19 = pTStack_5f8;
      pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
      uVar14 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               ::size((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                       *)local_528._vptr_TPZVec);
      uVar13 = *(uint *)(*(_func_int **)(local_528.fStore)->val_ + 8);
      uVar15 = *(uint *)(((_func_int **)(local_528.fStore)->val_)[1] + 8);
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      uVar13 = *(uint *)(**(long **)&(local_528.fStore)->dx_ + 8);
      uVar23 = *(uint *)((*(long **)&(local_528.fStore)->dx_)[1] + 8);
      if ((int)uVar23 < (int)uVar13) {
        uVar23 = uVar13;
      }
      if ((int)uVar23 < (int)uVar15) {
        uVar23 = uVar15;
      }
      if ((int)uVar23 < (int)uVar14) {
        uVar23 = uVar14;
      }
      if (0 < (int)uVar23) {
        uVar24 = 0;
        do {
          pp_Var2 = (_func_int **)
                    FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                    ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                          *)&local_528,(int)uVar24);
          (&pTVar19->_vptr_TPZVec)[uVar24] = pp_Var2;
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
      }
      Fad<double>::~Fad((Fad<double> *)&local_508);
      Fad<double>::~Fad((Fad<double> *)&local_548);
      Fad<double>::~Fad((Fad<double> *)&local_568);
      Fad<double>::~Fad((Fad<double> *)&local_590);
      local_590._vptr_TPZVec = (_func_int **)local_5b8;
      local_590.fStore = (Fad<double> *)local_608;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_590);
      goto LAB_013e821c;
    }
    goto LAB_013e8230;
  case EBoundaryLayer:
    pTStack_5a0 = (TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1);
    local_568._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_608._0_8_ = &local_590;
    stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    local_4b8._0_8_ =
         (1.0 - (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))
                        ->_vptr_TPZVec) *
         (double)(local_230.super_TPZVec<Fad<double>_>.fStore)->val_ *
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec * (1.0 - (local_230.super_TPZVec<Fad<double>_>.fStore)->val_);
    uVar13 = ((local_230.super_TPZVec<Fad<double>_>.fStore)->dx_).num_elts;
    uVar15 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    if ((int)uVar15 < (int)uVar13) {
      uVar15 = uVar13;
    }
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    local_590.fNElements = (int64_t)pFVar1;
    local_608._8_8_ = (Fad<double> *)local_5b8;
    local_590._vptr_TPZVec = (_func_int **)&local_568;
    if ((int)uVar15 < 1) {
      pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    }
    else {
      local_4b8._8_4_ = uVar15;
      local_4b8._8_8_ = CONCAT44(uVar28,local_4b8._8_4_);
      local_590.fStore = (Fad<double> *)local_5e8;
      local_568.fStore = (Fad<double> *)pTStack_5a0;
      pEVar18 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar15 << 3);
      uVar13 = (pFVar1->dx_).num_elts;
      uVar15 = ((Vector<double> *)&((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fStore)->num_elts;
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
      pEStack_4a8 = pEVar18;
      if (0 < (int)uVar15) {
        uVar24 = 0;
        do {
          vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                  ::dx((FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                        *)local_608,(int)uVar24);
          *(value_type *)(pEVar18 + uVar24 * 8) = vVar7;
          uVar24 = uVar24 + 1;
          local_590.fNElements = (int64_t)local_230.super_TPZVec<Fad<double>_>.fStore;
        } while (uVar15 != uVar24);
      }
    }
    local_5b8._0_8_ = (Fad<double> *)0x4024000000000000;
    stack0xfffffffffffffa50 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    local_568.fStore = (Fad<double> *)local_608;
    local_608._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x4024000000000000;
    local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_568.fNElements = local_590.fNElements + 0x20;
    local_548._vptr_TPZVec = (_func_int **)&local_590;
    local_590.fStore = (Fad<double> *)local_5b8;
    local_548.fStore = (Fad<double> *)&local_568;
    local_5e8._0_8_ =
         FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
         ::val((FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                *)&local_548);
    pFVar1 = (Fad<double> *)stack0xfffffffffffffa20;
    uVar13 = *(uint *)(*(long *)((long)local_548._vptr_TPZVec + 8) + 8);
    uVar15 = *(uint *)(*(double **)((long)local_548._vptr_TPZVec + 0x10) + 1);
    if ((int)*(uint *)(*(double **)((long)local_548._vptr_TPZVec + 0x10) + 1) < (int)uVar13) {
      uVar15 = uVar13;
    }
    uVar13 = *(uint *)(*(long *)&(local_548.fStore)->dx_ + 8);
    uVar14 = *(uint *)(*(double **)((long)local_548.fStore + 0x10) + 1);
    if ((int)*(uint *)(*(double **)((long)local_548.fStore + 0x10) + 1) < (int)uVar13) {
      uVar14 = uVar13;
    }
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    stack0xfffffffffffffa20 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa20 & 0xffffffff00000000);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    if ((int)uVar14 < 1) {
      pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    }
    else {
      uStack_5dc = SUB84(pFVar1,4);
      stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5dc,uVar14);
      FVar20 = (FadCst<int>)operator_new__((ulong)uVar14 * 8);
      pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
      uVar24 = 0;
      FStack_5d8 = FVar20;
      do {
        vVar9 = FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                ::dx((FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                      *)&local_548,(int)uVar24);
        *(value_type *)((long)FVar20 + uVar24 * 8) = vVar9;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
    }
    Fad<double>::~Fad((Fad<double> *)local_608);
    Fad<double>::~Fad((Fad<double> *)local_5b8);
    local_5b8._0_8_ = (TPZVec<Fad<double>_> *)0x41206a9400000000;
    stack0xfffffffffffffa50 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    local_608._0_8_ = &local_590;
    local_608._8_8_ = (TPZVec<Fad<double>_> *)local_5b8;
    local_590._vptr_TPZVec = (_func_int **)local_4b8;
    local_590.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)local_608);
    goto LAB_013e8226;
  case EBubble:
    local_508.fStore = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
    local_548._vptr_TPZVec = (_func_int **)&local_508;
    local_508._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_548.fStore = local_230.super_TPZVec<Fad<double>_>.fStore + 2;
    local_568._vptr_TPZVec = (_func_int **)&local_548;
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_568.fStore = (Fad<double> *)&local_528;
    local_528.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_590._vptr_TPZVec = (_func_int **)&local_568;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_590.fStore = (Fad<double> *)&local_3b0;
    local_608._0_8_ = &local_590;
    local_4e0._16_8_ = local_5b8;
    local_5b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)((ulong)uStack_5ac << 0x20);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    local_608._8_8_ = local_4e0 + 0x10;
    local_528._vptr_TPZVec = (_func_int **)local_4b8;
    local_4c8 = (TPZVec<Fad<double>_> *)local_548.fStore;
    local_3b0._vptr_TPZVec = (_func_int **)local_5e8;
    local_3b0.fStore = local_508.fStore;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)local_608);
    goto LAB_013e8226;
  case EBubble2D:
    local_590.fStore = local_230.super_TPZVec<Fad<double>_>.fStore + 1;
    local_608._0_8_ = &local_590;
    local_590._vptr_TPZVec = (_func_int **)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_608._8_8_ = &local_568;
    local_568.fStore = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_5b8._0_8_ = local_608;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    unique0x00005300 = &local_548;
    local_568._vptr_TPZVec = (_func_int **)local_4b8;
    local_548._vptr_TPZVec = (_func_int **)local_5e8;
    local_548.fStore = local_590.fStore;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)local_5b8);
    goto LAB_013e8230;
  case ESinCosCircle:
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x4010000000000000;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_5b8._0_8_ = local_390 + 0x10;
    dVar31 = 4.0;
    unique0x10006e0c = (TPZVec<Fad<double>_> *)local_5e8;
    local_4b8._0_8_ = pow((double)local_390._16_8_,4.0);
    uVar11 = local_4b8._8_8_;
    uVar13 = local_5e8._8_4_;
    if ((int)local_5e8._8_4_ < (int)local_378) {
      uVar13 = local_378;
    }
    local_4b8._8_8_ = local_4b8._8_8_ & 0xffffffff00000000;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    if ((int)uVar13 < 1) {
      pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    }
    else {
      local_4b8._12_4_ = SUB84(uVar11,4);
      local_4b8._8_4_ = uVar13;
      pEVar18 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar13 * 8);
      pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
      uVar24 = 0;
      pEStack_4a8 = pEVar18;
      do {
        vVar5 = FadBinaryPow<Fad<double>,_Fad<double>_>::dx
                          ((FadBinaryPow<Fad<double>,_Fad<double>_> *)local_5b8,(int)uVar24);
        *(value_type *)(pEVar18 + uVar24 * 8) = vVar5;
        uVar24 = uVar24 + 1;
      } while (uVar13 != uVar24);
    }
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    pFVar1 = local_230.super_TPZVec<Fad<double>_>.fStore;
    local_2b0.val_ =
         (double)((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->
                 _vptr_TPZVec;
    uVar13 = ((Vector<double> *)
             &((TPZVec<Fad<double>_> *)(local_230.super_TPZVec<Fad<double>_>.fStore + 1))->fStore)->
             num_elts;
    local_2b0.dx_.ptr_to_data = (double *)0x0;
    pTVar19 = (TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore;
    local_2b0.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_2b0.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_2b0.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar13);
      pTVar19 = (TPZVec<Fad<double>_> *)local_230.super_TPZVec<Fad<double>_>.fStore;
    }
    local_2b0.defaultVal = (double)((TPZVec<Fad<double>_> *)(pFVar1 + 1))->fNAlloc;
    local_150.val_ = (double)pTVar19->_vptr_TPZVec;
    uVar13 = ((Vector<double> *)&pTVar19->fStore)->num_elts;
    local_150.dx_.ptr_to_data = (double *)0x0;
    local_150.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_150.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_150.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTVar19->fNElements,
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_150.defaultVal = (double)pTVar19->fNAlloc;
    atan2(local_150.defaultVal,dVar31);
    Fad<double>::~Fad(&local_150);
    Fad<double>::~Fad(&local_2b0);
    local_590.fStore = (Fad<double> *)local_5b8;
    local_5b8._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    stack0xfffffffffffffa50 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    local_508.fStore = (Fad<double> *)&local_590;
    local_548._vptr_TPZVec = (_func_int **)&local_508;
    local_568.fStore = (Fad<double> *)local_608;
    local_608._0_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    local_608._8_8_ = (ulong)(uint)local_608._12_4_ << 0x20;
    pTStack_5f8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_5f0 = (TPZVec<Fad<double>_> *)0x0;
    local_548.fStore = (Fad<double> *)&local_568;
    local_590.fNElements = (int64_t)local_5e8;
    local_568.fNElements = (int64_t)local_5e8;
    local_508._vptr_TPZVec = (_func_int **)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)&local_548);
LAB_013e821c:
    Fad<double>::~Fad((Fad<double> *)local_608);
LAB_013e8226:
    Fad<double>::~Fad((Fad<double> *)local_5b8);
    goto LAB_013e8230;
  case EHarmonic:
    local_498 = *(TPZVec<Fad<double>_> **)&local_570->fStore;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x400921fb54442d18;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5c8 = local_498 + 1;
    FStack_5d8.constant_ = 0x54442d18;
    FStack_5d8.defaultVal = 0x400921fb;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    local_5b8._0_8_ = (TPZVec<Fad<double>_> *)local_4b8;
    unique0x10006e04 = (TPZVec<Fad<double>_> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_5b8);
    break;
  case EHarmonic2:
    local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x3fd0000000000000;
    local_4b8._8_8_ = (ulong)(uint)local_4b8._12_4_ << 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)0x0;
    pTStack_4a0 = (TPZVec<Fad<double>_> *)0x0;
    local_5e8._0_8_ = (TPZVec<Fad<double>_> *)0x3ff921fb54442d18;
    stack0xfffffffffffffa20 = (TPZVec<Fad<double>_> *)((ulong)uStack_5dc << 0x20);
    FStack_5d8.constant_ = 0;
    FStack_5d8.defaultVal = 0;
    pTStack_5d0 = (TPZVec<Fad<double>_> *)0x0;
    unique0x00012000 = *(TPZVec<Fad<double>_> **)&local_570->fStore;
    local_528._vptr_TPZVec = (_func_int **)&local_3b0;
    local_528.fStore = (Fad<double> *)local_5b8;
    local_508._vptr_TPZVec = (_func_int **)&local_528;
    local_608._8_8_ = unique0x00012000 + 1;
    local_508.fStore = (Fad<double> *)local_608;
    local_548._vptr_TPZVec = (_func_int **)&local_508;
    local_4e0._0_8_ = local_390;
    local_4e0._8_8_ = &local_590;
    local_4e0._16_8_ = local_4e0;
    local_4c8 = &local_568;
    local_548.fStore = (Fad<double> *)(local_4e0 + 0x10);
    pTStack_5f8 = (TPZVec<Fad<double>_> *)local_5e8;
    pTStack_5a8 = (TPZVec<Fad<double>_> *)local_5e8;
    local_590.fStore = (Fad<double> *)unique0x00012000;
    local_590.fNElements = (int64_t)local_5e8;
    local_568.fStore = (Fad<double> *)local_608._8_8_;
    local_568.fNElements = (int64_t)local_5e8;
    local_3b0._vptr_TPZVec = (_func_int **)unique0x00012000;
    local_3b0.fStore = (Fad<double> *)local_4b8;
    local_390._0_8_ = local_608._8_8_;
    local_390._8_8_ = (TPZVec<Fad<double>_> *)local_4b8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)&local_548);
LAB_013e8230:
    Fad<double>::~Fad((Fad<double> *)local_5e8);
LAB_013e823a:
    pTVar19 = (TPZVec<Fad<double>_> *)local_4b8;
LAB_013e832c:
    Fad<double>::~Fad((Fad<double> *)pTVar19);
    break;
  case ESquareRootUpper:
    local_5e8._0_8_ = *(undefined8 *)&local_570->fStore;
    local_608._0_8_ = local_5e8._0_8_ + 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)local_608;
    dVar31 = (double)((TPZVec<Fad<double>_> *)(local_5e8._0_8_ + 0x20))->_vptr_TPZVec *
             (double)((TPZVec<Fad<double>_> *)(local_5e8._0_8_ + 0x20))->_vptr_TPZVec +
             (double)((TPZVec<Fad<double>_> *)local_5e8._0_8_)->_vptr_TPZVec *
             (double)((TPZVec<Fad<double>_> *)local_5e8._0_8_)->_vptr_TPZVec;
    dVar30 = 0.0;
    local_608._8_8_ = local_608._0_8_;
    unique0x1000732c = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
    if (dVar31 < 0.0) {
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
      local_5b8._0_8_ = sqrt(dVar31);
    }
    else {
      local_5b8._0_8_ = SQRT(dVar31);
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
    }
    pTVar19 = stack0xfffffffffffffa50;
    pp_Var2 = *(_func_int ***)local_4b8._8_8_;
    lVar25 = *(long *)(local_4b8._8_8_ + 8);
    uVar13 = *(uint *)(pp_Var2 + 1);
    uVar15 = *(uint *)(lVar25 + 8);
    if ((int)uVar15 < (int)uVar13) {
      uVar15 = uVar13;
    }
    lVar27 = *(long *)&pEStack_4a8->field_0x0;
    lVar3 = *(long *)(pEStack_4a8 + 8);
    uVar13 = *(uint *)(lVar27 + 8);
    uVar14 = *(uint *)(lVar3 + 8);
    if ((int)uVar14 < (int)uVar13) {
      uVar14 = uVar13;
    }
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    stack0xfffffffffffffa50 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    if (0 < (int)uVar14) {
      uStack_5ac = SUB84(pTVar19,4);
      stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5ac,uVar14);
      pTStack_5a8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar14 << 3);
    }
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    uVar13 = *(uint *)(pp_Var2 + 1);
    uVar15 = *(uint *)(lVar25 + 8);
    if ((int)uVar15 < (int)uVar13) {
      uVar15 = uVar13;
    }
    uVar13 = *(uint *)(lVar27 + 8);
    uVar14 = *(uint *)(lVar3 + 8);
    if ((int)uVar14 < (int)uVar13) {
      uVar14 = uVar13;
    }
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    if (0 < (int)uVar14) {
      uVar24 = 0;
      do {
        pp_Var2 = (_func_int **)
                  FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  ::dx((FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                        *)local_4b8,(int)uVar24);
        (&pTStack_5a8->_vptr_TPZVec)[uVar24] = pp_Var2;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
    }
    pdVar21 = *(double **)&local_570->fStore;
    local_310.val_ = pdVar21[4];
    uVar13 = *(uint *)(pdVar21 + 5);
    local_310.dx_.ptr_to_data = (double *)0x0;
    pdVar22 = pdVar21;
    local_310.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_310.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_310.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar21[6],
                 (EVP_PKEY_CTX *)(ulong)uVar13);
      pdVar22 = *(double **)&local_570->fStore;
    }
    local_310.defaultVal = pdVar21[7];
    local_1b0.val_ = *pdVar22;
    uVar13 = *(uint *)(pdVar22 + 1);
    local_1b0.dx_.ptr_to_data = (double *)0x0;
    local_1b0.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_1b0.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_1b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar22[2],
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_1b0.defaultVal = pdVar22[3];
    atan2(local_1b0.defaultVal,dVar30);
    Fad<double>::~Fad(&local_1b0);
    Fad<double>::~Fad(&local_310);
    uVar11 = local_608._8_8_;
    local_5c0 = (TPZVec<Fad<double>_> *)local_608._0_8_;
    local_90.val_ = (double)local_608._0_8_;
    local_90.dx_.num_elts = local_608._8_4_;
    local_90.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_608._8_4_ != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)local_608._8_4_) {
        uVar24 = (long)(int)local_608._8_4_ * 8;
      }
      local_90.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_90.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTStack_5f8,
                 (EVP_PKEY_CTX *)(uVar11 & 0xffffffff));
    }
    local_90.defaultVal = (double)pTStack_5f0;
    Fad<double>::~Fad(&local_90);
    if ((double)local_5c0 < 0.0) {
      local_608._0_8_ = (double)local_608._0_8_ + 6.283185307179586;
    }
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)local_5b8);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,
               (FadFuncSqrt<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_568._vptr_TPZVec = (_func_int **)&local_590;
    local_590.fStore = (Fad<double> *)0x3ff306fe0a31b715;
    local_590.fNElements = 0;
    FStack_5d8.constant_ = 2;
    FStack_5d8.defaultVal = 0;
    unique0x10006d84 = (TPZVec<Fad<double>_> *)local_608;
    local_590.fNAlloc = (int64_t)local_4b8;
    local_568.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&local_568);
    goto LAB_013e7cc4;
  case ESquareRootLower:
    local_5e8._0_8_ = *(undefined8 *)&local_570->fStore;
    local_608._0_8_ = local_5e8._0_8_ + 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)local_608;
    dVar31 = (double)((TPZVec<Fad<double>_> *)(local_5e8._0_8_ + 0x20))->_vptr_TPZVec *
             (double)((TPZVec<Fad<double>_> *)(local_5e8._0_8_ + 0x20))->_vptr_TPZVec +
             (double)((TPZVec<Fad<double>_> *)local_5e8._0_8_)->_vptr_TPZVec *
             (double)((TPZVec<Fad<double>_> *)local_5e8._0_8_)->_vptr_TPZVec;
    dVar30 = 0.0;
    local_608._8_8_ = local_608._0_8_;
    unique0x10007324 = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
    if (dVar31 < 0.0) {
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
      local_5b8._0_8_ = sqrt(dVar31);
    }
    else {
      local_5b8._0_8_ = SQRT(dVar31);
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
    }
    pTVar19 = stack0xfffffffffffffa50;
    pp_Var2 = *(_func_int ***)local_4b8._8_8_;
    lVar25 = *(long *)(local_4b8._8_8_ + 8);
    uVar13 = *(uint *)(pp_Var2 + 1);
    uVar15 = *(uint *)(lVar25 + 8);
    if ((int)uVar15 < (int)uVar13) {
      uVar15 = uVar13;
    }
    lVar27 = *(long *)&pEStack_4a8->field_0x0;
    lVar3 = *(long *)(pEStack_4a8 + 8);
    uVar13 = *(uint *)(lVar27 + 8);
    uVar14 = *(uint *)(lVar3 + 8);
    if ((int)uVar14 < (int)uVar13) {
      uVar14 = uVar13;
    }
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    stack0xfffffffffffffa50 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    if (0 < (int)uVar14) {
      uStack_5ac = SUB84(pTVar19,4);
      stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5ac,uVar14);
      pTStack_5a8 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar14 << 3);
    }
    pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    uVar13 = *(uint *)(pp_Var2 + 1);
    uVar15 = *(uint *)(lVar25 + 8);
    if ((int)uVar15 < (int)uVar13) {
      uVar15 = uVar13;
    }
    uVar13 = *(uint *)(lVar27 + 8);
    uVar14 = *(uint *)(lVar3 + 8);
    if ((int)uVar14 < (int)uVar13) {
      uVar14 = uVar13;
    }
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    if (0 < (int)uVar14) {
      uVar24 = 0;
      do {
        pp_Var2 = (_func_int **)
                  FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  ::dx((FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                        *)local_4b8,(int)uVar24);
        (&pTStack_5a8->_vptr_TPZVec)[uVar24] = pp_Var2;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
    }
    pdVar21 = *(double **)&local_570->fStore;
    local_2f0.val_ = pdVar21[4];
    uVar13 = *(uint *)(pdVar21 + 5);
    local_2f0.dx_.ptr_to_data = (double *)0x0;
    pdVar22 = pdVar21;
    local_2f0.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_2f0.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_2f0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar21[6],
                 (EVP_PKEY_CTX *)(ulong)uVar13);
      pdVar22 = *(double **)&local_570->fStore;
    }
    local_2f0.defaultVal = pdVar21[7];
    local_190.val_ = *pdVar22;
    uVar13 = *(uint *)(pdVar22 + 1);
    local_190.dx_.ptr_to_data = (double *)0x0;
    local_190.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_190.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_190.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar22[2],
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_190.defaultVal = pdVar22[3];
    atan2(local_190.defaultVal,dVar30);
    Fad<double>::~Fad(&local_190);
    Fad<double>::~Fad(&local_2f0);
    uVar11 = local_608._8_8_;
    local_5c0 = (TPZVec<Fad<double>_> *)local_608._0_8_;
    local_70.val_ = (double)local_608._0_8_;
    local_70.dx_.num_elts = local_608._8_4_;
    local_70.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_608._8_4_ != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)local_608._8_4_) {
        uVar24 = (long)(int)local_608._8_4_ * 8;
      }
      local_70.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_70.dx_.ptr_to_data,(EVP_PKEY_CTX *)pTStack_5f8,
                 (EVP_PKEY_CTX *)(uVar11 & 0xffffffff));
    }
    local_70.defaultVal = (double)pTStack_5f0;
    Fad<double>::~Fad(&local_70);
    if (0.0 < (double)local_5c0) {
      local_608._0_8_ = (double)local_608._0_8_ + -6.283185307179586;
    }
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)local_5b8);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,
               (FadFuncSqrt<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_568._vptr_TPZVec = (_func_int **)&local_590;
    local_590.fStore = (Fad<double> *)0x3ff306fe0a31b715;
    local_590.fNElements = 0;
    FStack_5d8.constant_ = 2;
    FStack_5d8.defaultVal = 0;
    unique0x10006d74 = (TPZVec<Fad<double>_> *)local_608;
    local_590.fNAlloc = (int64_t)local_4b8;
    local_568.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&local_568);
    goto LAB_013e7cc4;
  case ESquareRoot:
    local_5e8._0_8_ = *(undefined8 *)&local_570->fStore;
    local_608._0_8_ = local_5e8._0_8_ + 0x20;
    pEStack_4a8 = (EVP_PKEY_CTX *)local_608;
    dVar31 = (double)((TPZVec<Fad<double>_> *)(local_5e8._0_8_ + 0x20))->_vptr_TPZVec *
             (double)((TPZVec<Fad<double>_> *)(local_5e8._0_8_ + 0x20))->_vptr_TPZVec +
             (double)((TPZVec<Fad<double>_> *)local_5e8._0_8_)->_vptr_TPZVec *
             (double)((TPZVec<Fad<double>_> *)local_5e8._0_8_)->_vptr_TPZVec;
    dVar30 = 0.0;
    local_608._8_8_ = local_608._0_8_;
    unique0x1000731c = (TPZVec<Fad<double>_> *)local_5e8._0_8_;
    if (dVar31 < 0.0) {
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
      local_5b8._0_8_ = sqrt(dVar31);
    }
    else {
      local_5b8._0_8_ = SQRT(dVar31);
      local_4b8._8_8_ = (TPZVec<Fad<double>_> *)local_5e8;
    }
    pTVar19 = stack0xfffffffffffffa50;
    pp_Var2 = *(_func_int ***)local_4b8._8_8_;
    lVar25 = *(long *)(local_4b8._8_8_ + 8);
    uVar13 = *(uint *)(pp_Var2 + 1);
    uVar15 = *(uint *)(lVar25 + 8);
    if ((int)uVar15 < (int)uVar13) {
      uVar15 = uVar13;
    }
    lVar27 = *(long *)&pEStack_4a8->field_0x0;
    lVar3 = *(long *)(pEStack_4a8 + 8);
    uVar13 = *(uint *)(lVar27 + 8);
    uVar14 = *(uint *)(lVar3 + 8);
    if ((int)uVar14 < (int)uVar13) {
      uVar14 = uVar13;
    }
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    stack0xfffffffffffffa50 =
         (TPZVec<Fad<double>_> *)((ulong)stack0xfffffffffffffa50 & 0xffffffff00000000);
    pTStack_5a8 = (TPZVec<Fad<double>_> *)0x0;
    if ((int)uVar14 < 1) {
      pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
    }
    else {
      uStack_5ac = SUB84(pTVar19,4);
      stack0xfffffffffffffa50 = (TPZVec<Fad<double>_> *)CONCAT44(uStack_5ac,uVar14);
      pTVar19 = (TPZVec<Fad<double>_> *)operator_new__((ulong)uVar14 << 3);
      uVar13 = *(uint *)(pp_Var2 + 1);
      uVar15 = *(uint *)(lVar25 + 8);
      uVar14 = *(uint *)(lVar27 + 8);
      uVar23 = *(uint *)(lVar3 + 8);
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      if ((int)uVar23 < (int)uVar14) {
        uVar23 = uVar14;
      }
      if ((int)uVar23 < (int)uVar15) {
        uVar23 = uVar15;
      }
      pTStack_5a0 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_5a8 = pTVar19;
      if (0 < (int)uVar23) {
        uVar24 = 0;
        do {
          pp_Var2 = (_func_int **)
                    FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    ::dx((FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                          *)local_4b8,(int)uVar24);
          (&pTVar19->_vptr_TPZVec)[uVar24] = pp_Var2;
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
      }
    }
    pdVar21 = *(double **)&local_570->fStore;
    local_2d0.val_ = pdVar21[4];
    uVar13 = *(uint *)(pdVar21 + 5);
    local_2d0.dx_.ptr_to_data = (double *)0x0;
    pdVar22 = pdVar21;
    local_2d0.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_2d0.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_2d0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar21[6],
                 (EVP_PKEY_CTX *)(ulong)uVar13);
      pdVar22 = *(double **)&local_570->fStore;
    }
    local_2d0.defaultVal = pdVar21[7];
    local_170.val_ = *pdVar22;
    uVar13 = *(uint *)(pdVar22 + 1);
    local_170.dx_.ptr_to_data = (double *)0x0;
    local_170.dx_.num_elts = uVar13;
    if ((long)(int)uVar13 != 0) {
      uVar24 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar24 = (long)(int)uVar13 * 8;
      }
      local_170.dx_.ptr_to_data = (double *)operator_new__(uVar24);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_170.dx_.ptr_to_data,(EVP_PKEY_CTX *)pdVar22[2],
                 (EVP_PKEY_CTX *)(ulong)uVar13);
    }
    local_170.defaultVal = pdVar22[3];
    atan2(local_170.defaultVal,dVar30);
    Fad<double>::~Fad(&local_170);
    Fad<double>::~Fad(&local_2d0);
    FadFuncSqrt<Fad<double>_>::FadFuncSqrt
              ((FadFuncSqrt<Fad<double>_> *)local_5e8,(Fad<double> *)local_5b8);
    FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_4b8,
               (FadFuncSqrt<Fad<double>_> *)local_5e8);
    Fad<double>::~Fad((Fad<double> *)local_5e8);
    local_568._vptr_TPZVec = (_func_int **)&local_590;
    local_590.fStore = (Fad<double> *)0x3ff306fe0a31b715;
    local_590.fNElements = 0;
    FStack_5d8.constant_ = 2;
    FStack_5d8.defaultVal = 0;
    unique0x10006d64 = (TPZVec<Fad<double>_> *)local_608;
    local_590.fNAlloc = (int64_t)local_4b8;
    local_568.fStore = (Fad<double> *)local_5e8;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&local_568);
LAB_013e7cc4:
    pTVar19 = (TPZVec<Fad<double>_> *)(local_4b8 + 8);
LAB_013e8318:
    Fad<double>::~Fad((Fad<double> *)pTVar19);
    Fad<double>::~Fad((Fad<double> *)local_608);
    pTVar19 = (TPZVec<Fad<double>_> *)local_5b8;
    goto LAB_013e832c;
  case ELaplace2D:
    Fad<double>::Fad((Fad<double> *)&local_590);
    pFVar1 = disp->fStore;
    pFVar1->val_ = 1.0;
    if ((pFVar1->dx_).num_elts != 0) {
      local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
      Vector<double>::operator=(&pFVar1->dx_,(double *)local_4b8);
    }
    if (0 < this->fmaxIter) {
      pTVar19 = (TPZVec<Fad<double>_> *)0x1;
      do {
        local_5c0 = (TPZVec<Fad<double>_> *)(double)(int)pTVar19;
        local_568._vptr_TPZVec = (_func_int **)((double)local_5c0 * 3.141592653589793);
        local_568.fStore = (Fad<double> *)((ulong)local_568.fStore & 0xffffffff00000000);
        local_568.fNElements = 0;
        local_568.fNAlloc = 0;
        FadFuncTanh<Fad<double>_>::FadFuncTanh
                  ((FadFuncTanh<Fad<double>_> *)local_5e8,(Fad<double> *)&local_568);
        FadExpr<FadFuncTanh<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncTanh<Fad<double>_>_> *)local_4b8,
                   (FadFuncTanh<Fad<double>_> *)local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        local_4c8 = (TPZVec<Fad<double>_> *)0xfffffffe;
        local_4c0 = (FadExpr<FadFuncTanh<Fad<double>_>_> *)local_4b8;
        FadFuncCos<Fad<double>_>::FadFuncCos
                  ((FadFuncCos<Fad<double>_> *)local_5b8,(Fad<double> *)&local_568);
        FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_5e8,
                   (FadFuncCos<Fad<double>_> *)local_5b8);
        Fad<double>::~Fad((Fad<double> *)local_5b8);
        local_528.fStore = (Fad<double> *)0x3fb9f02f6222c722;
        local_528.fNElements = 0;
        local_508.fStore = (Fad<double> *)0x3fb9f02f6222c722;
        local_508.fNElements = 0;
        local_508.fNAlloc = (int64_t)&local_528;
        local_528.fNAlloc = (int64_t)local_5e8;
        FadFuncSin<Fad<double>_>::FadFuncSin
                  ((FadFuncSin<Fad<double>_> *)local_608,(Fad<double> *)&local_568);
        FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_5b8,
                   (FadFuncSin<Fad<double>_> *)local_608);
        Fad<double>::~Fad((Fad<double> *)local_608);
        local_3b0.fStore = (Fad<double> *)((double)local_5c0 * 0.1591549430918954);
        local_3b0.fNElements = 0;
        local_360._16_8_ = &local_508;
        local_348 = &local_3b0;
        local_390._0_8_ = local_4e0 + 0x10;
        local_390._8_8_ = local_360 + 0x10;
        local_608._0_8_ = local_360;
        local_4e0._0_8_ = local_390;
        local_608._8_8_ = pTVar19;
        local_4e0._8_8_ = (TPZVec<Fad<double>_> *)local_608;
        local_3b0.fNAlloc = (int64_t)local_5b8;
        local_360._0_8_ = &local_568;
        local_360._8_8_ = pTVar19;
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,FadExpr<FadFuncTanh<Fad<double>>>>>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncCos<Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSin<Fad<double>>>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<int>>>,FadCst<int>>>>>
                  ((Fad<double> *)&local_548,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
                    *)local_4e0);
        Fad<double>::~Fad((Fad<double> *)(local_5b8 + 8));
        Fad<double>::~Fad((Fad<double> *)(local_5e8 + 8));
        Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
        FadFuncCosh<Fad<double>_>::FadFuncCosh
                  ((FadFuncCosh<Fad<double>_> *)local_5e8,(Fad<double> *)&local_568);
        FadExpr<FadFuncCosh<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncCosh<Fad<double>_>_> *)local_4b8,
                   (FadFuncCosh<Fad<double>_> *)local_5e8);
        Fad<double>::~Fad((Fad<double> *)local_5e8);
        FStack_5d8 = *(FadCst<int> *)&local_570->fStore;
        local_508._vptr_TPZVec = (_func_int **)&local_528;
        local_3b0._vptr_TPZVec = (_func_int **)((long)FStack_5d8 + 0x20);
        local_3b0.fStore = (Fad<double> *)0x1;
        pTStack_5a8 = &local_3b0;
        local_608._0_8_ = &local_508;
        local_608._8_8_ = local_5b8;
        unique0x10006d54 = &local_568;
        unique0x10006dfc = &local_568;
        local_528._vptr_TPZVec = (_func_int **)&local_548;
        local_528.fStore = (Fad<double> *)local_4b8;
        local_508.fStore = (Fad<double> *)local_5e8;
        Fad<double>::operator+=
                  (disp->fStore,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>_>
                    *)local_608);
        Fad<double>::~Fad((Fad<double> *)(local_4b8 + 8));
        Fad<double>::~Fad((Fad<double> *)&local_548);
        Fad<double>::~Fad((Fad<double> *)&local_568);
        bVar4 = (long)pTVar19 < (long)this->fmaxIter;
        pTVar19 = (TPZVec<Fad<double>_> *)((long)&pTVar19->_vptr_TPZVec + 1);
      } while (bVar4);
    }
    pTVar19 = &local_590;
    goto LAB_013e832c;
  default:
    pFVar1 = disp->fStore;
    pFVar1->val_ = 0.0;
    if ((pFVar1->dx_).num_elts != 0) {
      local_4b8._0_8_ = (TPZVec<Fad<double>_> *)0x0;
      Vector<double>::operator=(&pFVar1->dx_,(double *)local_4b8);
    }
  }
  Fad<double>::~Fad((Fad<double> *)(local_390 + 0x10));
  Fad<double>::~Fad((Fad<double> *)(local_340 + 0x10));
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_230);
  return;
}

Assistant:

void TLaplaceExample1::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &disp) const
{
    TPZManVector<TVar,3> xloc(x);
    for (int i = 0; i<xloc.size(); i++) {
        xloc[i] -= fCenter[i];
    }
    TVar r2 = 0.;
    for (int i=0; i<fDimension; i++) {
        r2 += xloc[i]*xloc[i];
    }
    TVar r = sqrt(r2);
    disp[0] = xloc[0]*(TVar)(0.);
    
    REAL xval[2] = {shapeFAD::val(x[0]),shapeFAD::val(x[1])};
     
    switch (fExact) {
        case EConst:
            disp[0] += gC;
            break;
        case EX:
            disp[0] += xloc[0];
            break;
        case ESinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]);
        }
            break;
        case E10SinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*10.);
        }
            break;
            
            case E2SinSin:
            {
                disp[0] += (TVar)(1.);
                for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*2.);
            }
                break;
        case ESinDist:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*1.1);
        }
            break;
        case ECosCos:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= cos((TVar)M_PI*xloc[i]/2);
        }
            break;
        case EArcTan://(1+0.3sin(10Pi x))*(1+0.5cos(10Pi r)*arctan(100*(r-0.5))
        {
            TVar atanco = (r-(TVar)0.5)*100.;
            TVar freq = 10.;
            TVar mult = (TVar(1)+TVar(0.3)*sin(TVar(M_PI)*xloc[0]*freq))*(TVar(1)+TVar(0.5)*cos(TVar(M_PI)*r*freq));
            disp[0] = atan(atanco)*mult;
        }
            break;
        case EArcTanSingular://5*(0.5*pi + arctang(20(0.25 - r^2))))
        {
            REAL B = 5.;
            if(fDimension==1)
                B *= 0.25;
            else if(fDimension==3)
                B *= 4;
            // Argument value (arc) to compute ArcTangent( arc )
            TVar RCircle = 0.5;
            TVar Force = 20.;
            TVar arc = Force*(RCircle*RCircle-r2);
            TVar Prod = 1.;
            for (int i=0; i<fDimension; i++) {
                Prod *= x[i]*(1.-x[i]);
            }
            TVar temp = 0.5*M_PI + atan(arc);
            disp[0] = B*temp;
        }
            break;
            
            //----
        case ESinMark://(r^(2/3)-r^2)sin(20/3) para homogeneo dirichlet e r^(2/3)sin(20/3) para f=0
        {

            TVar theta = atan2(xloc[1], xloc[0]);//theta=arctan(y/x)
            auto thetaval = shapeFAD::val(theta);
            if (thetaval < (0.)) theta += 2. * M_PI;

            // Verification to avoid numerical errors when x > 0 and y = 0
            if (xval[0] > 0 && xval[1] < 1e-15 && xval[1] > -1.e-15) {
               disp[0] = 0.;
            }
            else {
                TVar factor = pow(r,TVar (2.)/TVar (3.));//pow(r,TVar (2.)/TVar (3.))-pow(r,TVar (2.));//
                disp[0] = factor * (sin((TVar) (2.) * theta / TVar(3.)));
            }


        }
            break;
            
            //--
     
        case ESinSinDirNonHom: //sin(2 pi x)sin(2pi y)+1/(x+y+1)
        {
            
            disp[0]=(sin((TVar)M_PI*2.*xloc[0]))*sin((TVar)M_PI*2.*xloc[1])+(TVar)1./(xloc[0]+xloc[1]+(TVar)(1.));
            
        }
            
            break;
            
        case ESteklovNonConst://Steklov function for eigenvalue lambda=0.53544094560246 and permeability Omega1=Omega=3, Omega2=Omega4=5
        {
            TVar coefs[] = {1., 0.44721359549995787, 2.3333333333333326,
                -0.7453559924999296, 0.5555555555555556,
                -0.9441175904999111, -0.48148148148148173,
                -2.4017026424997736};
            TVar lambda = 0.53544094560246;
            TVar t = atan2(xloc[1], xloc[0]);
            REAL tval = shapeFAD::val(t);
            if(tval < (0.)) t += 2.*M_PI;
            
            if((xval[0] >=(0.)) && (xval[1] >=(0.))){
               // std::cout<<"1o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]=pow(r, lambda)*(TVar(coefs[0])*cos(lambda *t) + TVar(coefs[1])*sin(lambda*t) );
               // std::cout<<"valor da funcao no 1o. Q "<<disp[0]<<std::endl;
               // disp[0]=pow(r, lambda)*(cos(lambda *t)+TVar(-1.)*TVar(0.1)*sin(lambda*t));
                
            }
            
            if(( xval[0] <= (0.)) && (xval[1] >=(0.))){
               // std::cout<<"2o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]= pow(r, lambda)*(TVar(coefs[2])*cos(lambda*t) + TVar(coefs[3])*sin(lambda* t));
                
             //    std::cout<<"valor da funcao no 2o. Q "<<disp[0]<<std::endl;
            }
            
            if((xval[0] <(0.)) && ( xval[1] <= (0.))){
               // std::cout<<"3o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                disp[0]= pow(r, lambda)*(TVar(coefs[4] )*cos(lambda*t) + TVar(coefs[5])*sin(lambda* t));
                //disp[0]= pow(r, lambda)*(TVar(-1.)*TVar(0.882757 )*cos(lambda*t) + TVar(-1.)*TVar(0.480355)*sin(lambda* t));
              //   std::cout<<"valor da funcao no 3o. Q "<<disp[0]<<std::endl;
            }
            if(( xval[0] >= (0.)) && ( xval[1] < (0.))){
              //  std::cout<<"4o. Q "<<xloc<< " r " << r << " th " << t << std::endl;

                disp[0]= pow(r, lambda)*(TVar(coefs[6])*cos(lambda*t) +  TVar(coefs[7])*sin(lambda* t));
                
               // std::cout<<"valor da funcao no 4o. Q "<<disp[0]<<std::endl;
                
            }
            
            
        }
            break;
            
            case EGalvisNonConst:
        {
            
            TVar k1 = 2;
            TVar k2 = 5;
            
            
            if((xval[0] <= (0.)) && (xval[1] <= (0.))){
                
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+1.));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"3o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if(( xval[0] > (0.)) && (xval[1] < (0.))){
             
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1 + TVar(1.)));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"4o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if((xval[0] < (0.)) && ( xval[1] >= (0.))){
              
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"2o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            if(( xval[0] >= (0.)) && ( xval[1] >= (0.))){
               
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
            //    std::cout<<"1o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
                
            }
            
            
        }
            break;
            
        case EBoundaryLayer:{
            TVar term1 = xloc[0]*xloc[1]*(1.-xloc[0])*(1.-xloc[1]);
            TVar term2 = exp(TVar(10.)*xloc[0])*exp(TVar(10.)*xloc[1]);
            TVar factor = TVar(537930);
            
            disp[0] = (term1*term2)/factor;
            
          //  std::cout<<"Pto "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
            
            
        }
            break;
            
        case EBubble:{
            
            disp[0] = xloc[0]*xloc[1]*xloc[2]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1])*(TVar(1.)-xloc[2]);
           // std::cout<<"pto "<<xloc <<" f(x) "<<disp<<std::endl;
        }
            break;
        case EBubble2D:{

            disp[0] = xloc[0]*xloc[1]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1]);
        }
            break;
        case ESinCosCircle:{
            
            TVar coef = pow(r, TVar(4.));
            TVar theta=atan2(xloc[1],xloc[0]);
            disp[0] = coef*sin(TVar(2.)*theta)*cos(TVar(2.)*theta);
            
            
        }
            break;
        case EHarmonic:
            disp[0] = exp(M_PI*x[0])*sin(M_PI*x[1]);
            break;

        case EHarmonic2:
        {
            TVar a1 = 1./4;
            TVar alpha = M_PI/2;
            disp[0] = x[0]*a1*cos(x[0]*alpha)*cosh(x[1]*alpha) + x[1]*a1*sin(x[0]*alpha)*sinh(x[1]*alpha);
        }
            break;
        case ESquareRoot:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootLower:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) > 0.) {
                theta -= (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootUpper:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) < 0.) {
                theta += (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ELaplace2D:
        {
            TVar Ck;
            disp[0] = 1.;
            for(int k = 1 ; k < fmaxIter+1; k++){
                TVar kpi = k*M_PI;
                TVar ck = -2/tanh(kpi)*(0.1013211836423378 -0.1013211836423378*cos(kpi)-0.1591549430918954 *k* sin(kpi))/(kpi*k*k);
                disp[0]+=ck/cosh(kpi)*cos(kpi*x[0])*cosh(kpi*(x[1]-1));
            }
        }
            break;

        default:
            disp[0] = 0.;
            break;
    }
}